

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

bool __thiscall Minisat::IntOption::parse(IntOption *this,char *str)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  char *end;
  char *local_20;
  
  if (*str == '-') {
    pcVar1 = (this->super_Option).name;
    lVar3 = 0;
    cVar5 = *pcVar1;
    while (cVar5 != '\0') {
      if (str[lVar3 + 1] != cVar5) {
        return false;
      }
      lVar2 = lVar3 + 1;
      lVar3 = lVar3 + 1;
      cVar5 = pcVar1[lVar2];
    }
    if (str[lVar3 + 1] == '=') {
      lVar3 = strtol(str + lVar3 + 2,&local_20,10);
      bVar6 = local_20 != (char *)0x0;
      if (!bVar6) {
        return bVar6;
      }
      iVar4 = (int)lVar3;
      if ((this->range).end < iVar4) {
        parse();
      }
      else if ((this->range).begin <= iVar4) {
        this->value = iVar4;
        return bVar6;
      }
      parse();
      if (Option::getOptionList()::options == '\0') {
        Option::getOptionList();
      }
      return true;
    }
  }
  return false;
}

Assistant:

Int64Range(int64_t b, int64_t e) : begin(b), end(e) {}